

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O1

void CfdcapiPsbtDumpLog(int result,void *handle)

{
  bool bVar1;
  int iVar2;
  char *message;
  AssertionResult gtest_ar;
  char *output;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  char *local_18;
  
  if (result != 0) {
    local_18 = (char *)0x0;
    iVar2 = CfdGetLastErrorMessage(handle,&local_18);
    if (iVar2 == 0) {
      message = "";
      testing::internal::CmpHelperSTREQ(local_28,"\"\"","output","",local_18);
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_20.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_20.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2d,message);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_38.ptr_ + 8))();
          }
          local_38.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

static void CfdcapiPsbtDumpLog(int result, void* handle) {
  if (result != kCfdSuccess) {
    char* output = nullptr;
    int ret = CfdGetLastErrorMessage(handle, &output);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("", output);
    }
  }
}